

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O3

void gimage::rgbToHSV<float,gimage::PixelTraits<float>>
               (ImageFloat *ret,Image<float,_gimage::PixelTraits<float>_> *image)

{
  float ***pppfVar1;
  long lVar2;
  long lVar3;
  float val;
  float sat;
  float hue;
  float local_44;
  float local_40;
  float local_3c;
  long local_38;
  
  Image<float,_gimage::PixelTraits<float>_>::setSize(ret,image->width,image->height,3);
  lVar3 = image->height;
  if (0 < lVar3) {
    lVar2 = image->width;
    local_38 = 0;
    do {
      if (0 < lVar2) {
        lVar3 = 0;
        do {
          pppfVar1 = image->img;
          rgbToHSV<float>(&local_3c,&local_40,&local_44,(*pppfVar1)[local_38][lVar3],
                          pppfVar1[1][local_38][lVar3],pppfVar1[2][local_38][lVar3],3.4028235e+38);
          pppfVar1 = ret->img;
          (*pppfVar1)[local_38][lVar3] = local_3c;
          pppfVar1[1][local_38][lVar3] = local_40;
          pppfVar1[2][local_38][lVar3] = local_44;
          lVar3 = lVar3 + 1;
          lVar2 = image->width;
        } while (lVar3 < lVar2);
        lVar3 = image->height;
      }
      local_38 = local_38 + 1;
    } while (local_38 < lVar3);
  }
  return;
}

Assistant:

void rgbToHSV(ImageFloat &ret, const Image<T, traits> &image)
{
  float hue, sat, val;

  assert(image.getDepth() == 3);

  ret.setSize(image.getWidth(), image.getHeight(), 3);

  for (long k=0; k<image.getHeight(); k++)
  {
    for (long i=0; i<image.getWidth(); i++)
    {
      rgbToHSV(hue, sat, val, image.getW(i, k, 0), image.getW(i, k, 1),
               image.getW(i, k, 2), image.absMaxValue());

      ret.setLimited(i, k, 0, hue);
      ret.setLimited(i, k, 1, sat);
      ret.setLimited(i, k, 2, val);
    }
  }
}